

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O0

void __thiscall
cnn::Tensor::load<boost::archive::text_iarchive>(Tensor *this,text_iarchive *ar,uint param_3)

{
  uint uVar1;
  int iVar2;
  float *in_RSI;
  long in_RDI;
  Dim *in_stack_ffffffffffffff98;
  Dim *in_stack_ffffffffffffffa0;
  Dim *this_00;
  void *local_20;
  undefined8 local_18;
  size_t local_10;
  void *local_8;
  
  boost::archive::detail::interface_iarchive<boost::archive::text_iarchive>::operator&
            ((interface_iarchive<boost::archive::text_iarchive> *)in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff98);
  uVar1 = Dim::size(in_stack_ffffffffffffffa0);
  local_10 = (ulong)uVar1 << 2;
  local_18 = 0x20;
  iVar2 = posix_memalign(&local_20,0x20,local_10);
  if (iVar2 == 0) {
    local_8 = local_20;
  }
  else {
    local_8 = (void *)0x0;
  }
  *(void **)(in_RDI + 0x28) = local_8;
  this_00 = *(Dim **)(in_RDI + 0x28);
  Dim::size(this_00);
  boost::serialization::make_array<float,unsigned_int>(in_RSI,(uint)((ulong)this_00 >> 0x20));
  boost::archive::detail::interface_iarchive<boost::archive::text_iarchive>::operator&
            ((interface_iarchive<boost::archive::text_iarchive> *)this_00,
             (array_wrapper<float> *)in_stack_ffffffffffffff98);
  return;
}

Assistant:

void load(Archive& ar, const unsigned int) {
    ar & d;
    // TODO(mem) - load device and use it to create memory allocator
    // Devices should probably know how to load and save data to disk
#if HAVE_CUDA
    CUDA_CHECK(cudaMalloc(&v, d.size() * sizeof(float)));
    float* vc = static_cast<float*>(std::malloc(d.size() * sizeof(float)));
    ar & boost::serialization::make_array(vc, d.size());
    CUDA_CHECK(cudaMemcpyAsync(v, vc, d.size() * sizeof(float), cudaMemcpyHostToDevice));
#else
    v = static_cast<float*>(_mm_malloc(d.size() * sizeof(float), 32));
    ar & boost::serialization::make_array(v, d.size());
#endif
  }